

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberZ.cpp
# Opt level: O1

void __thiscall
OpenMD::NumberZ::NumberZ
          (NumberZ *this,SimInfo *info,string *filename,string *sele,int nzbins,int axis)

{
  SelectionEvaluator *this_00;
  pointer pcVar1;
  long *plVar2;
  char *pcVar3;
  pointer pOVar4;
  char *pcVar5;
  long lVar6;
  undefined1 local_80 [24];
  long lStack_68;
  SelectionManager *local_60;
  string *local_58;
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nzbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__NumberZ_0033ae38;
  local_58 = &this->selectionScript_;
  (this->selectionScript_)._M_dataplus._M_p = (pointer)&(this->selectionScript_).field_2;
  pcVar1 = (sele->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + sele->_M_string_length);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_60 = &this->seleMan_;
  SelectionManager::SelectionManager(local_60,info);
  (this->thermo_).info_ = info;
  (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->numberZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->numberZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->numberZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->axis_ = axis;
  (this->axisLabel_)._M_dataplus._M_p = (pointer)&(this->axisLabel_).field_2;
  (this->axisLabel_)._M_string_length = 0;
  (this->axisLabel_).field_2._M_local_buf[0] = '\0';
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_80,this_00);
    lVar6 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar6),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_80._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar6));
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_80);
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&this->numberZ_,(ulong)(this->super_StaticAnalyser).nBins_);
  pcVar5 = "z";
  if (this->axis_ == 1) {
    pcVar5 = "y";
  }
  pcVar3 = "x";
  if (this->axis_ != 0) {
    pcVar3 = pcVar5;
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->axisLabel_,0,(char *)(this->axisLabel_)._M_string_length,(ulong)pcVar3);
  getPrefix(&local_50,filename);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  pOVar4 = (pointer)(plVar2 + 2);
  if ((pointer)*plVar2 == pOVar4) {
    local_80._16_8_ =
         (pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lStack_68 = plVar2[3];
    local_80._0_8_ = (pointer)(local_80 + 0x10);
  }
  else {
    local_80._16_8_ =
         (pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_80._0_8_ = (pointer)*plVar2;
  }
  local_80._8_8_ = plVar2[1];
  *plVar2 = (long)pOVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((pointer)local_80._0_8_ != (pointer)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_80._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

NumberZ::NumberZ(SimInfo* info, const std::string& filename,
                   const std::string& sele, int nzbins, int axis) :
      StaticAnalyser(info, filename, nzbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info), thermo_(info),
      axis_(axis) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    numberZ_.resize(nBins_);

    switch (axis_) {
    case 0:
      axisLabel_ = "x";
      break;
    case 1:
      axisLabel_ = "y";
      break;
    case 2:
    default:
      axisLabel_ = "z";
      break;
    }

    setOutputName(getPrefix(filename) + ".NumberZ");
  }